

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O1

Bac_Man_t * Bac_ManInsertGia(Bac_Man_t *p,Gia_Man_t *pGia)

{
  Bac_Man_t *pNew;
  
  pNew = Bac_ManDupUserBoxes(p);
  Bac_ManMarkNodesGia(p,pGia);
  Bac_ManRemapBarbufs(pNew,p);
  Bac_NtkInsertGia(pNew,pGia);
  Bac_ManMoveNames(pNew,p);
  return pNew;
}

Assistant:

Bac_Man_t * Bac_ManInsertGia( Bac_Man_t * p, Gia_Man_t * pGia )
{
    Bac_Man_t * pNew = Bac_ManDupUserBoxes( p );
    Bac_ManMarkNodesGia( p, pGia );
    Bac_ManRemapBarbufs( pNew, p );
    Bac_NtkInsertGia( pNew, pGia );
    Bac_ManMoveNames( pNew, p );
    return pNew;
}